

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

bool pbrt::ParseArg<bool*>
               (char ***argv,string *name,bool *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string sStack_d8;
  bool *local_b8;
  string value;
  string arg;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,**argv,(allocator<char> *)&sStack_d8);
  if (arg._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&sStack_d8,(ulong)&arg);
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_d8,(ulong)&arg);
  }
  std::__cxx11::string::operator=((string *)&arg,(string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  anon_unknown_50::normalizeArg(&sStack_d8,&arg);
  std::operator+(&local_50,name,'=');
  local_b8 = out;
  anon_unknown_50::normalizeArg(&value,&local_50);
  bVar1 = anon_unknown_50::matchPrefix(&sStack_d8,&value);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_d8);
  if (!bVar1) {
    anon_unknown_50::normalizeArg(&sStack_d8,&arg);
    anon_unknown_50::normalizeArg(&value,name);
    _Var3 = std::operator==(&sStack_d8,&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&sStack_d8);
    if (_Var3) {
      *argv = *argv + 1;
      bVar1 = true;
      *local_b8 = true;
    }
    else {
      bVar1 = false;
    }
    goto LAB_0025720c;
  }
  *argv = *argv + 1;
  std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
  anon_unknown_50::normalizeArg(&sStack_d8,&value);
  bVar1 = std::operator==(&sStack_d8,"false");
  std::__cxx11::string::~string((string *)&sStack_d8);
  if (bVar1) {
    bVar2 = false;
LAB_002571c1:
    bVar1 = true;
    *local_b8 = bVar2;
  }
  else {
    anon_unknown_50::normalizeArg(&sStack_d8,&value);
    bVar1 = std::operator==(&sStack_d8,"true");
    std::__cxx11::string::~string((string *)&sStack_d8);
    bVar2 = true;
    if (bVar1) goto LAB_002571c1;
    StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
              (&local_70,(pbrt *)"invalid value \"%s\" for %s argument",(char *)&value,name,in_R8);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(onError,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&value);
LAB_0025720c:
  std::__cxx11::string::~string((string *)&arg);
  return bVar1;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}